

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdAddUtxoTemplateForFundRawTx
              (void *handle,void *fund_handle,char *txid,uint32_t vout,int64_t amount,
              char *descriptor,char *asset,char *scriptsig_template)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  CfdException *pCVar5;
  UtxoData utxo;
  allocator local_5b9;
  string local_5b8;
  undefined1 local_598 [8];
  int local_590;
  undefined4 uStack_58c;
  char *local_588 [5];
  void *local_560;
  undefined1 local_558 [40];
  Txid local_530;
  uint32_t local_510;
  string local_318 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  bool local_2f0;
  AddressType local_2e8;
  void *local_2e0;
  ConfidentialAssetId local_2d8 [15];
  Script local_68;
  
  local_560 = handle;
  cfd::Initialize();
  pcVar2 = local_558 + 0x10;
  local_558._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"FundRawTxData","");
  cfd::capi::CheckBuffer(fund_handle,(string *)local_558);
  if ((pointer)local_558._0_8_ != pcVar2) {
    operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
  }
  bVar4 = cfd::capi::IsEmptyString(txid);
  if (!bVar4) {
    bVar4 = cfd::capi::IsEmptyString(descriptor);
    if (bVar4) {
      local_558._0_8_ = "cfdcapi_transaction.cpp";
      local_558._8_4_ = 0xc24;
      local_558._16_8_ = "CfdAddUtxoTemplateForFundRawTx";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_558,kCfdLogLevelWarning,"descriptor is null or empty.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_558._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,"Failed to parameter. descriptor is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_558);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::UtxoData::UtxoData((UtxoData *)local_558);
    local_2e8 = kP2shAddress;
    local_558._0_8_ = (pointer)0x0;
    local_2e0 = (void *)0x0;
    std::__cxx11::string::string((string *)&local_5b8,txid,&local_5b9);
    cfd::core::Txid::Txid((Txid *)local_598,&local_5b8);
    cfd::core::Txid::operator=(&local_530,(Txid *)local_598);
    local_598 = (undefined1  [8])&PTR__Txid_0087c9b8;
    pvVar3 = (void *)CONCAT44(uStack_58c,local_590);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_588[1] - (long)pvVar3);
    }
    paVar1 = &local_5b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
    }
    local_510 = vout;
    cfd::core::Amount::Amount((Amount *)local_598,amount);
    local_2f0 = local_590._0_1_;
    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598;
    std::__cxx11::string::string((string *)local_598,descriptor,(allocator *)&local_5b8);
    std::__cxx11::string::operator=(local_318,(string *)local_598);
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,(ulong)((long)local_588[0] + 1));
    }
    local_2e8 = kP2shAddress;
    bVar4 = cfd::capi::IsEmptyString(scriptsig_template);
    if (!bVar4) {
      std::__cxx11::string::string((string *)&local_5b8,scriptsig_template,&local_5b9);
      cfd::core::Script::Script((Script *)local_598,&local_5b8);
      cfd::core::Script::operator=(&local_68,(Script *)local_598);
      cfd::core::Script::~Script((Script *)local_598);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(char *)((long)fund_handle + 0x35) == '\x01') {
      bVar4 = cfd::capi::IsEmptyString(asset);
      if (bVar4) {
        local_598 = (undefined1  [8])0x63077b;
        local_590 = 0xc3b;
        local_588[0] = "CfdAddUtxoTemplateForFundRawTx";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)local_598,kCfdLogLevelWarning,"utxo asset is null or empty."
                  );
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_598 = (undefined1  [8])local_588;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_598,"Failed to parameter. utxo asset is null or empty.","");
        cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_598);
        __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::__cxx11::string::string((string *)&local_5b8,asset,&local_5b9);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_598,&local_5b8);
      cfd::core::ConfidentialAssetId::operator=(local_2d8,(ConfidentialAssetId *)local_598);
      local_598 = (undefined1  [8])&PTR__ConfidentialAssetId_0087ccc8;
      pvVar3 = (void *)CONCAT44(uStack_58c,local_590);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_588[1] - (long)pvVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
    }
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
              (*(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)((long)fund_handle + 0x38)
               ,(value_type *)local_558);
    cfd::UtxoData::~UtxoData((UtxoData *)local_558);
    return 0;
  }
  local_558._0_8_ = "cfdcapi_transaction.cpp";
  local_558._8_4_ = 0xc1e;
  local_558._16_8_ = "CfdAddUtxoTemplateForFundRawTx";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_558,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_558._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_558,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_558);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddUtxoTemplateForFundRawTx(
    void* handle, void* fund_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* descriptor, const char* asset,
    const char* scriptsig_template) {
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(descriptor)) {
      warn(CFD_LOG_SOURCE, "descriptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null or empty.");
    }
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.txid = Txid(txid);
    utxo.vout = vout;
    utxo.amount = Amount(amount);
    utxo.descriptor = std::string(descriptor);
    utxo.address_type = AddressType::kP2shAddress;  // force init
    if (!IsEmptyString(scriptsig_template)) {
      utxo.scriptsig_template = Script(std::string(scriptsig_template));
    }
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      if (IsEmptyString(asset)) {
        warn(CFD_LOG_SOURCE, "utxo asset is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. utxo asset is null or empty.");
      }
      utxo.asset = ConfidentialAssetId(asset);
#endif  // CFD_DISABLE_ELEMENTS
    }
    buffer->utxos->push_back(utxo);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}